

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void door_handling(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  int iVar2;
  tgestate_t *in_RSI;
  tgestate_t *in_RDI;
  uint8_t iters;
  vischar_t *in_stack_00000008;
  direction_t direction;
  door_t *door_pos;
  char local_1a;
  door_t *state_00;
  
  if (in_RDI->room_index == '\0') {
    state_00 = doors;
    bVar1 = *(byte *)((long)&in_RSI->speccy + 2);
    if (1 < bVar1) {
      state_00 = doors + 1;
    }
    local_1a = '\x10';
    do {
      if ((((byte)((tgestate_t *)state_00)->width & 3) == bVar1) &&
         (iVar2 = door_in_range(in_RDI,state_00), iVar2 == 0)) {
        in_RDI->current_door = '\x10' - local_1a;
        iVar2 = is_door_locked((tgestate_t *)state_00);
        if (iVar2 != 0) {
          return;
        }
        *(char *)((long)in_RSI->jmpbuf_main[0].__jmpbuf + 0x1c) =
             (char)((int)(uint)(byte)((tgestate_t *)state_00)->width >> 2);
        if (((byte)((tgestate_t *)state_00)->width & 3) < 2) {
          transition(in_RSI,(mappos8_t *)state_00);
          return;
        }
        transition(in_RSI,(mappos8_t *)state_00);
        return;
      }
      state_00 = (door_t *)&((tgestate_t *)state_00)->columns;
      local_1a = local_1a + -1;
    } while (local_1a != '\0');
  }
  else {
    door_handling_interior((tgestate_t *)door_pos,in_stack_00000008);
  }
  return;
}

Assistant:

void door_handling(tgestate_t *state, vischar_t *vischar)
{
  const door_t *door_pos;  /* was HL */
  direction_t   direction; /* was E */
  uint8_t       iters;     /* was B */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Interior doors are handled by another routine. */
  if (state->room_index > room_0_OUTDOORS)
  {
    door_handling_interior(state, vischar); /* was tail call */
    return;
  }

  /* Select a start position in doors[] based on the direction the hero is
   * facing. */
  door_pos = &doors[0];
  direction = vischar->direction;
  if (direction >= direction_BOTTOM_RIGHT) /* BOTTOM_RIGHT or BOTTOM_LEFT */
    door_pos = &doors[1];

  /* The first 16 (pairs of) entries in doors[] are the only ones with
   * room_0_OUTDOORS as a destination, so only consider those. */
  iters = 16;
  do
  {
    if ((door_pos->room_and_direction & door_FLAGS_MASK_DIRECTION) == direction)
      if (door_in_range(state, door_pos) == 0)
        goto found;
    door_pos += 2;
  }
  while (--iters);

  /* Conv: Removed unused 'A &= B' op. */

  return;

found:
  state->current_door = 16 - iters;

  if (is_door_locked(state))
    return;

  vischar->room = (door_pos->room_and_direction & ~door_FLAGS_MASK_DIRECTION) >> 2; // sampled HL = $792E (in doors[])
  ASSERT_ROOM_VALID(vischar->room);
  if ((door_pos->room_and_direction & door_FLAGS_MASK_DIRECTION) < direction_BOTTOM_RIGHT) /* TL or TR */
    /* Point to the next door's pos */
    transition(state, &door_pos[1].mappos);
  else
    /* Point to the previous door's pos */
    transition(state, &door_pos[-1].mappos);

  NEVER_RETURNS; // highly likely if this is only tiggered by the hero
}